

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
GameInfoIRCCommand::trigger
          (GameInfoIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  size_type sVar4;
  const_pointer pvVar5;
  basic_string_view<char,_std::char_traits<char>_> *args;
  rep rVar6;
  rep rVar7;
  rep rVar8;
  char *pcVar9;
  size_t sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  size_t local_218;
  char *local_210;
  string local_1f8;
  __sv_type local_1d8;
  size_t local_1c8;
  char *pcStack_1c0;
  string local_1b8;
  __sv_type local_198;
  size_t local_188;
  char *pcStack_180;
  basic_string_view<char,_std::char_traits<char>_> local_178 [2];
  basic_string_view<char,_std::char_traits<char>_> local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  __sv_type local_118;
  size_t local_108;
  char *pcStack_100;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  string local_c8;
  __sv_type local_a8;
  size_t local_98;
  char *pcStack_90;
  duration<long,_std::ratio<1L,_1000L>_> local_80;
  duration<long,_std::ratio<1L,_1L>_> local_78;
  seconds time;
  Map *map;
  Server *server;
  uint i;
  bool match;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  GameInfoIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)nick._M_str;
  pcVar9 = channel._M_str;
  sVar10 = channel._M_len;
  lVar2 = Jupiter::IRC::Client::getChannel(source,sVar10,pcVar9);
  if (lVar2 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    bVar1 = false;
    server._4_4_ = 0;
    while( true ) {
      RenX::getCore();
      uVar3 = RenX::Core::getServerCount();
      if (server._4_4_ == uVar3) break;
      uVar3 = RenX::getCore();
      lVar2 = RenX::Core::getServer(uVar3);
      uVar3 = RenX::Server::isLogChanType((int)lVar2);
      if ((uVar3 & 1) != 0) {
        bVar1 = true;
        time.__r = RenX::Server::getMap();
        local_80.__r = RenX::Server::getGameTime();
        local_78.__r = (rep)std::chrono::
                            duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000l>>
                                      (&local_80);
        local_98 = sVar10;
        pcStack_90 = pcVar9;
        bVar11 = (basic_string_view<char,_std::char_traits<char>_>)RenX::Server::getGameVersion();
        local_d8 = bVar11;
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_d8);
        bVar11 = (basic_string_view<char,_std::char_traits<char>_>)RenX::Server::getGameVersion();
        local_e8 = bVar11;
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_e8);
        string_printf_abi_cxx11_(&local_c8,"\x0303[GameInfo] \x03%.*s",sVar4,pvVar5);
        local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c8);
        Jupiter::IRC::Client::sendMessage
                  (source,local_98,pcStack_90,local_a8._M_len,local_a8._M_str);
        std::__cxx11::string::~string((string *)&local_c8);
        local_108 = sVar10;
        pcStack_100 = pcVar9;
        local_148 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     )sv("\x0303[GameInfo] \x0310Map\x03: ",0x17);
        args = (basic_string_view<char,_std::char_traits<char>_> *)(time.__r + 0x10);
        local_158 = sv("; \x0310GUID\x03: ",0xc);
        RenX::formatGUID_abi_cxx11_((Map *)local_178);
        jessilib::
        join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                  (&local_138,(jessilib *)local_148._M_local_buf,args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158,
                   local_178,args_3);
        local_118 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_138);
        Jupiter::IRC::Client::sendMessage
                  (source,local_108,pcStack_100,local_118._M_len,local_118._M_str);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)local_178);
        local_188 = sVar10;
        pcStack_180 = pcVar9;
        rVar6 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_78);
        rVar7 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_78);
        rVar8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_78);
        string_printf_abi_cxx11_
                  (&local_1b8,"\x0303[GameInfo] \x0310Elapsed time\x03: %.2lld:%.2lld:%.2lld",
                   rVar6 / 0xe10,(rVar7 % 0xe10) / 0x3c,rVar8 % 0x3c);
        local_198 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1b8);
        Jupiter::IRC::Client::sendMessage
                  (source,local_188,pcStack_180,local_198._M_len,local_198._M_str);
        std::__cxx11::string::~string((string *)&local_1b8);
        local_1c8 = sVar10;
        pcStack_1c0 = pcVar9;
        sVar4 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                          ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                           (lVar2 + 0x10));
        string_printf_abi_cxx11_
                  (&local_1f8,"\x0303[GameInfo] \x03There are \x0310%d\x03 players online.",sVar4);
        local_1d8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1f8);
        Jupiter::IRC::Client::sendMessage
                  (source,local_1c8,pcStack_1c0,local_1d8._M_len,local_1d8._M_str);
        std::__cxx11::string::~string((string *)&local_1f8);
      }
      server._4_4_ = server._4_4_ + 1;
    }
    if (!bVar1) {
      bVar11 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
      local_218 = bVar11._M_len;
      local_210 = bVar11._M_str;
      Jupiter::IRC::Client::sendMessage(source,sVar10,pcVar9,local_218,local_210);
    }
  }
  return;
}

Assistant:

void GameInfoIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		bool match = false;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				match = true;
				const RenX::Map &map = server->getMap();
				std::chrono::seconds time = std::chrono::duration_cast<std::chrono::seconds>(server->getGameTime());
				source->sendMessage(channel, string_printf(IRCCOLOR "03[GameInfo] " IRCCOLOR "%.*s", server->getGameVersion().size(), server->getGameVersion().data()));
				source->sendMessage(channel, jessilib::join<std::string>(IRCCOLOR "03[GameInfo] " IRCCOLOR "10Map" IRCCOLOR ": "sv, map.name, "; " IRCCOLOR "10GUID" IRCCOLOR ": "sv, RenX::formatGUID(map)));
				source->sendMessage(channel, string_printf(IRCCOLOR "03[GameInfo] " IRCCOLOR "10Elapsed time" IRCCOLOR ": %.2lld:%.2lld:%.2lld", time.count() / 3600, (time.count() % 3600) / 60, time.count() % 60));
				source->sendMessage(channel, string_printf(IRCCOLOR "03[GameInfo] " IRCCOLOR "There are " IRCCOLOR "10%d" IRCCOLOR " players online.", server->players.size()));
			}
		}
		if (match == false)
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}